

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O3

void __thiscall Controller::~Controller(Controller *this)

{
  list<Person_*,_std::allocator<Person_*>_> *plVar1;
  Bank *pBVar2;
  _List_node_base *p_Var3;
  pointer pcVar4;
  Boat *pBVar5;
  _List_node_base *p_Var6;
  
  plVar1 = &this->players;
  for (p_Var6 = (this->players).super__List_base<Person_*,_std::allocator<Person_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var6 != (_List_node_base *)plVar1;
      p_Var6 = p_Var6->_M_next) {
    if (p_Var6[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x18))();
    }
  }
  pBVar2 = this->leftSide;
  if (pBVar2 != (Bank *)0x0) {
    (pBVar2->super_Container)._vptr_Container = (_func_int **)&PTR_validateState_00107ad0;
    p_Var6 = (pBVar2->super_Container).people.super__List_base<Person_*,_std::allocator<Person_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var6 != (_List_node_base *)&(pBVar2->super_Container).people) {
      p_Var3 = p_Var6->_M_next;
      operator_delete(p_Var6);
      p_Var6 = p_Var3;
    }
    pcVar4 = (pBVar2->super_Container).name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(pBVar2->super_Container).name.field_2) {
      operator_delete(pcVar4);
    }
  }
  operator_delete(pBVar2);
  pBVar2 = this->rightSide;
  if (pBVar2 != (Bank *)0x0) {
    (pBVar2->super_Container)._vptr_Container = (_func_int **)&PTR_validateState_00107ad0;
    p_Var6 = (pBVar2->super_Container).people.super__List_base<Person_*,_std::allocator<Person_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var6 != (_List_node_base *)&(pBVar2->super_Container).people) {
      p_Var3 = p_Var6->_M_next;
      operator_delete(p_Var6);
      p_Var6 = p_Var3;
    }
    pcVar4 = (pBVar2->super_Container).name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(pBVar2->super_Container).name.field_2) {
      operator_delete(pcVar4);
    }
  }
  operator_delete(pBVar2);
  pBVar5 = this->boat;
  if (pBVar5 != (Boat *)0x0) {
    (pBVar5->super_Container)._vptr_Container = (_func_int **)&PTR_validateState_00107ad0;
    p_Var6 = (pBVar5->super_Container).people.super__List_base<Person_*,_std::allocator<Person_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var6 != (_List_node_base *)&(pBVar5->super_Container).people) {
      p_Var3 = p_Var6->_M_next;
      operator_delete(p_Var6);
      p_Var6 = p_Var3;
    }
    pcVar4 = (pBVar5->super_Container).name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(pBVar5->super_Container).name.field_2) {
      operator_delete(pcVar4);
    }
  }
  operator_delete(pBVar5);
  p_Var6 = (plVar1->super__List_base<Person_*,_std::allocator<Person_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var6 != (_List_node_base *)plVar1) {
    p_Var3 = p_Var6->_M_next;
    operator_delete(p_Var6);
    p_Var6 = p_Var3;
  }
  return;
}

Assistant:

Controller::~Controller() {
    // Removes every player
    for (Person* p : players)
        delete p;

    // Deletes the baks and boat
    delete leftSide;
    delete rightSide;
    delete boat;
}